

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JsBuiltInEngineInterfaceExtensionObject.cpp
# Opt level: O0

void __thiscall
Js::JsBuiltInEngineInterfaceExtensionObject::EnsureSourceInfo
          (JsBuiltInEngineInterfaceExtensionObject *this)

{
  code *pcVar1;
  bool bVar2;
  SRCINFO **ppSVar3;
  ScriptContext *pSVar4;
  Recycler *pRVar5;
  SourceContextInfo *this_00;
  undefined4 *puVar6;
  SRCINFO *ptr;
  undefined1 local_78 [8];
  SRCINFO si;
  TrackAllocData local_40;
  SourceContextInfo *local_18;
  SourceContextInfo *sourceContextInfo;
  JsBuiltInEngineInterfaceExtensionObject *this_local;
  
  sourceContextInfo = (SourceContextInfo *)this;
  ppSVar3 = Memory::WriteBarrierPtr::operator_cast_to_SRCINFO__
                      ((WriteBarrierPtr *)&this->sourceInfo);
  if (*ppSVar3 == (SRCINFO *)0x0) {
    pSVar4 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                       (&(this->super_EngineExtensionObjectBase).scriptContext);
    pRVar5 = ScriptContext::GetRecycler(pSVar4);
    Memory::TrackAllocData::CreateTrackAllocData
              (&local_40,(type_info *)&SourceContextInfo::typeinfo,0,0xffffffffffffffff,
               "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
               ,0xf1);
    pRVar5 = Memory::Recycler::TrackAllocInfo(pRVar5,&local_40);
    si._32_8_ = Memory::Recycler::AllocZeroInlined;
    this_00 = (SourceContextInfo *)new<Memory::Recycler>(0x38,pRVar5,0x744a10);
    SourceContextInfo::SourceContextInfo(this_00);
    this_00->dwHostSourceContext = 0xfffffffffffffffe;
    this_00->isHostDynamicDocument = true;
    this_00->sourceContextId = 0xfffffffe;
    local_18 = this_00;
    if (this_00 == (SourceContextInfo *)0x0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JsBuiltInEngineInterfaceExtensionObject.cpp"
                                  ,0xf6,"(sourceContextInfo != nullptr)",
                                  "sourceContextInfo != nullptr");
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    SRCINFO::SRCINFO((SRCINFO *)local_78);
    memset(local_78,0,0x28);
    Memory::WriteBarrierPtr<SourceContextInfo>::operator=
              ((WriteBarrierPtr<SourceContextInfo> *)local_78,local_18);
    pSVar4 = Memory::WriteBarrierPtr<Js::ScriptContext>::operator->
                       (&(this->super_EngineExtensionObjectBase).scriptContext);
    ptr = ScriptContext::AddHostSrcInfo(pSVar4,(SRCINFO *)local_78);
    Memory::WriteBarrierPtr<SRCINFO>::operator=(&this->sourceInfo,ptr);
  }
  return;
}

Assistant:

void JsBuiltInEngineInterfaceExtensionObject::EnsureSourceInfo()
    {
        if (sourceInfo == nullptr)
        {
            SourceContextInfo* sourceContextInfo = RecyclerNewStructZ(scriptContext->GetRecycler(), SourceContextInfo);
            sourceContextInfo->dwHostSourceContext = Js::Constants::JsBuiltInSourceContext;
            sourceContextInfo->isHostDynamicDocument = true;
            sourceContextInfo->sourceContextId = Js::Constants::JsBuiltInSourceContextId;

            Assert(sourceContextInfo != nullptr);

            SRCINFO si;
            memset(&si, 0, sizeof(si));
            si.sourceContextInfo = sourceContextInfo;
            sourceInfo = scriptContext->AddHostSrcInfo(&si);
        }
    }